

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_4x4_sse4_1
               (int16_t *input,int32_t *coeff,int input_stride,TX_TYPE tx_type,int bd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  long lVar18;
  int8_t (*paiVar19) [5];
  undefined7 in_register_00000009;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined4 uVar36;
  undefined1 in_XMM0 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined4 uVar37;
  undefined1 auVar28 [16];
  undefined4 uVar38;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar39;
  undefined1 auVar35 [16];
  int iVar48;
  int iVar49;
  undefined1 in_XMM1 [16];
  undefined1 auVar40 [16];
  int iVar50;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar66;
  int iVar67;
  undefined1 in_XMM3 [16];
  int iVar68;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  longlong lVar69;
  undefined1 in_XMM4 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar75;
  undefined1 auVar74 [16];
  int32_t iVar76;
  int32_t iVar83;
  longlong lVar77;
  int32_t iVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int32_t iVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int32_t iVar86;
  int32_t iVar93;
  int32_t iVar94;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int32_t iVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar102;
  int iVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  int iVar104;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar105;
  int iVar113;
  int iVar114;
  undefined1 auVar106 [16];
  int iVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i in [4];
  undefined1 local_58 [4];
  int iStack_54;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  __m128i alVar25;
  __m128i alVar27;
  __m128i alVar29;
  __m128i alVar34;
  
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    auVar42 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM4,*(undefined8 *)(input + input_stride * 3));
    iVar102 = auVar28._0_4_ << iVar17;
    iVar103 = auVar42._0_4_ << iVar17;
    iVar104 = auVar55._0_4_ << iVar17;
    iVar17 = auVar61._0_4_ << iVar17;
    auVar71 = ZEXT416(0xd);
    auVar106._8_4_ = 0x16a1;
    auVar106._0_8_ = 0x16a1000016a1;
    auVar106._12_4_ = 0x16a1;
    auVar87._8_4_ = 0xc3f;
    auVar87._0_8_ = 0xc3f00000c3f;
    auVar87._12_4_ = 0xc3f;
    auVar96._8_4_ = 0x1d90;
    auVar96._0_8_ = 0x1d9000001d90;
    auVar96._12_4_ = 0x1d90;
    auVar40._0_4_ = iVar17 + iVar102;
    auVar40._4_4_ = auVar61._4_4_ + auVar28._4_4_;
    auVar40._8_4_ = auVar61._8_4_ + auVar28._8_4_;
    auVar40._12_4_ = auVar61._12_4_ + auVar28._12_4_;
    auVar24._0_4_ = iVar102 - iVar17;
    auVar24._4_4_ = auVar28._4_4_ - auVar61._4_4_;
    auVar24._8_4_ = auVar28._8_4_ - auVar61._8_4_;
    auVar24._12_4_ = auVar28._12_4_ - auVar61._12_4_;
    auVar70._0_4_ = iVar104 + iVar103;
    auVar70._4_4_ = auVar55._4_4_ + auVar42._4_4_;
    auVar70._8_4_ = auVar55._8_4_ + auVar42._8_4_;
    auVar70._12_4_ = auVar55._12_4_ + auVar42._12_4_;
    auVar51._0_4_ = iVar103 - iVar104;
    auVar51._4_4_ = auVar42._4_4_ - auVar55._4_4_;
    auVar51._8_4_ = auVar42._8_4_ - auVar55._8_4_;
    auVar51._12_4_ = auVar42._12_4_ - auVar55._12_4_;
    auVar28 = pmulld(auVar40,auVar106);
    auVar42 = pmulld(auVar70,auVar106);
    iVar17 = auVar28._0_4_ + 0x1000;
    iVar102 = auVar28._4_4_ + 0x1000;
    iVar103 = auVar28._8_4_ + 0x1000;
    iVar104 = auVar28._12_4_ + 0x1000;
    iVar60 = iVar17 + auVar42._0_4_ >> auVar71;
    iVar66 = iVar102 + auVar42._4_4_ >> auVar71;
    iVar67 = iVar103 + auVar42._8_4_ >> auVar71;
    iVar68 = iVar104 + auVar42._12_4_ >> auVar71;
    iVar75 = iVar17 - auVar42._0_4_ >> auVar71;
    iVar48 = iVar102 - auVar42._4_4_ >> auVar71;
    iVar49 = iVar103 - auVar42._8_4_ >> auVar71;
    iVar50 = iVar104 - auVar42._12_4_ >> auVar71;
    auVar55 = pmulld(auVar87,auVar51);
    auVar42 = pmulld(auVar51,auVar96);
    auVar28 = pmulld(auVar96,auVar24);
    iVar105 = auVar55._0_4_ + 0x1000 + auVar28._0_4_ >> auVar71;
    iVar113 = auVar55._4_4_ + 0x1000 + auVar28._4_4_ >> auVar71;
    iVar114 = auVar55._8_4_ + 0x1000 + auVar28._8_4_ >> auVar71;
    iVar115 = auVar55._12_4_ + 0x1000 + auVar28._12_4_ >> auVar71;
    auVar28 = pmulld(auVar24,auVar87);
    iVar17 = (auVar28._0_4_ + 0x1000) - auVar42._0_4_ >> auVar71;
    iVar102 = (auVar28._4_4_ + 0x1000) - auVar42._4_4_ >> auVar71;
    iVar103 = (auVar28._8_4_ + 0x1000) - auVar42._8_4_ >> auVar71;
    iVar104 = (auVar28._12_4_ + 0x1000) - auVar42._12_4_ >> auVar71;
    auVar28 = ZEXT416(0xd);
    auVar97._8_4_ = 0xc3f;
    auVar97._0_8_ = 0xc3f00000c3f;
    auVar97._12_4_ = 0xc3f;
    auVar107._8_4_ = 0x1d90;
    auVar107._0_8_ = 0x1d9000001d90;
    auVar107._12_4_ = 0x1d90;
    auVar88._0_4_ = iVar68 + iVar60;
    auVar88._4_4_ = iVar115 + iVar105;
    auVar88._8_4_ = iVar50 + iVar75;
    auVar88._12_4_ = iVar104 + iVar17;
    auVar78._0_4_ = iVar60 - iVar68;
    auVar78._4_4_ = iVar105 - iVar115;
    auVar78._8_4_ = iVar75 - iVar50;
    auVar78._12_4_ = iVar17 - iVar104;
    auVar41._0_4_ = iVar67 + iVar66;
    auVar41._4_4_ = iVar114 + iVar113;
    auVar41._8_4_ = iVar49 + iVar48;
    auVar41._12_4_ = iVar103 + iVar102;
    auVar52._0_4_ = iVar66 - iVar67;
    auVar52._4_4_ = iVar113 - iVar114;
    auVar52._8_4_ = iVar48 - iVar49;
    auVar52._12_4_ = iVar102 - iVar103;
    auVar10._8_4_ = 0x16a1;
    auVar10._0_8_ = 0x16a1000016a1;
    auVar10._12_4_ = 0x16a1;
    auVar55 = pmulld(auVar88,auVar10);
    auVar11._8_4_ = 0x16a1;
    auVar11._0_8_ = 0x16a1000016a1;
    auVar11._12_4_ = 0x16a1;
    auVar42 = pmulld(auVar41,auVar11);
    iVar17 = auVar55._0_4_ + 0x1000;
    iVar102 = auVar55._4_4_ + 0x1000;
    iVar103 = auVar55._8_4_ + 0x1000;
    iVar104 = auVar55._12_4_ + 0x1000;
    iVar86 = iVar17 - auVar42._0_4_ >> auVar28;
    iVar93 = iVar102 - auVar42._4_4_ >> auVar28;
    iVar94 = iVar103 - auVar42._8_4_ >> auVar28;
    iVar95 = iVar104 - auVar42._12_4_ >> auVar28;
    auVar55 = pmulld(auVar52,auVar97);
    auVar71 = pmulld(auVar78,auVar107);
    auVar80 = pmulld(auVar78,auVar97);
    auVar61 = pmulld(auVar52,auVar107);
    iVar76 = (auVar80._0_4_ + 0x1000) - auVar61._0_4_ >> auVar28;
    iVar83 = (auVar80._4_4_ + 0x1000) - auVar61._4_4_ >> auVar28;
    iVar84 = (auVar80._8_4_ + 0x1000) - auVar61._8_4_ >> auVar28;
    iVar85 = (auVar80._12_4_ + 0x1000) - auVar61._12_4_ >> auVar28;
    *coeff = auVar42._0_4_ + iVar17 >> auVar28;
    coeff[1] = auVar42._4_4_ + iVar102 >> auVar28;
    coeff[2] = auVar42._8_4_ + iVar103 >> auVar28;
    coeff[3] = auVar42._12_4_ + iVar104 >> auVar28;
    coeff[4] = auVar71._0_4_ + 0x1000 + auVar55._0_4_ >> auVar28;
    coeff[5] = auVar71._4_4_ + 0x1000 + auVar55._4_4_ >> auVar28;
    coeff[6] = auVar71._8_4_ + 0x1000 + auVar55._8_4_ >> auVar28;
    coeff[7] = auVar71._12_4_ + 0x1000 + auVar55._12_4_ >> auVar28;
    goto LAB_0041eae5;
  case 1:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    goto LAB_0041e974;
  case 2:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    goto LAB_0041eb41;
  case 3:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    goto LAB_0041ef8a;
  case 4:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)(input + input_stride * 3));
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride * 2));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)input);
LAB_0041e974:
    iVar17 = (int)cVar5;
    iStack_54 = auVar28._4_4_;
    local_58 = (undefined1  [4])(auVar28._0_4_ << iVar17);
    uStack_50._0_4_ = auVar28._8_4_;
    uStack_50._4_4_ = auVar28._12_4_;
    local_48._4_4_ = auVar42._4_4_;
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    auVar71 = ZEXT416(0xd);
    auVar99._8_4_ = 0xc3f;
    auVar99._0_8_ = 0xc3f00000c3f;
    auVar99._12_4_ = 0xc3f;
    auVar109._8_4_ = 0x1d90;
    auVar109._0_8_ = 0x1d9000001d90;
    auVar109._12_4_ = 0x1d90;
    auVar90._0_4_ = uStack_50._4_4_ + (int)local_58;
    auVar90._4_4_ = local_48._12_4_ + local_48._0_4_;
    auVar90._8_4_ = local_38._12_4_ + local_38._0_4_;
    auVar90._12_4_ = local_28._12_4_ + local_28._0_4_;
    auVar81._0_4_ = (int)local_58 - uStack_50._4_4_;
    auVar81._4_4_ = local_48._0_4_ - local_48._12_4_;
    auVar81._8_4_ = local_38._0_4_ - local_38._12_4_;
    auVar81._12_4_ = local_28._0_4_ - local_28._12_4_;
    auVar57._0_4_ = (int)uStack_50 + iStack_54;
    auVar57._4_4_ = local_48._8_4_ + local_48._4_4_;
    auVar57._8_4_ = local_38._8_4_ + local_38._4_4_;
    auVar57._12_4_ = local_28._8_4_ + local_28._4_4_;
    auVar31._0_4_ = iStack_54 - (int)uStack_50;
    auVar31._4_4_ = local_48._4_4_ - local_48._8_4_;
    auVar31._8_4_ = local_38._4_4_ - local_38._8_4_;
    auVar31._12_4_ = local_28._4_4_ - local_28._8_4_;
    auVar8._8_4_ = 0x16a1;
    auVar8._0_8_ = 0x16a1000016a1;
    auVar8._12_4_ = 0x16a1;
    auVar28 = pmulld(auVar90,auVar8);
    auVar9._8_4_ = 0x16a1;
    auVar9._0_8_ = 0x16a1000016a1;
    auVar9._12_4_ = 0x16a1;
    auVar42 = pmulld(auVar57,auVar9);
    iVar17 = auVar28._0_4_ + 0x1000;
    iVar102 = auVar28._4_4_ + 0x1000;
    iVar103 = auVar28._8_4_ + 0x1000;
    iVar104 = auVar28._12_4_ + 0x1000;
    iVar86 = iVar17 - auVar42._0_4_ >> auVar71;
    iVar93 = iVar102 - auVar42._4_4_ >> auVar71;
    iVar94 = iVar103 - auVar42._8_4_ >> auVar71;
    iVar95 = iVar104 - auVar42._12_4_ >> auVar71;
    auVar55 = pmulld(auVar31,auVar99);
    auVar61 = pmulld(auVar81,auVar109);
    auVar80 = pmulld(auVar81,auVar99);
    auVar28 = pmulld(auVar31,auVar109);
    iVar76 = (auVar80._0_4_ + 0x1000) - auVar28._0_4_ >> auVar71;
    iVar83 = (auVar80._4_4_ + 0x1000) - auVar28._4_4_ >> auVar71;
    iVar84 = (auVar80._8_4_ + 0x1000) - auVar28._8_4_ >> auVar71;
    iVar85 = (auVar80._12_4_ + 0x1000) - auVar28._12_4_ >> auVar71;
    *coeff = auVar42._0_4_ + iVar17 >> auVar71;
    coeff[1] = auVar42._4_4_ + iVar102 >> auVar71;
    coeff[2] = auVar42._8_4_ + iVar103 >> auVar71;
    coeff[3] = auVar42._12_4_ + iVar104 >> auVar71;
    coeff[4] = auVar61._0_4_ + 0x1000 + auVar55._0_4_ >> auVar71;
    coeff[5] = auVar61._4_4_ + 0x1000 + auVar55._4_4_ >> auVar71;
    coeff[6] = auVar61._8_4_ + 0x1000 + auVar55._8_4_ >> auVar71;
    coeff[7] = auVar61._12_4_ + 0x1000 + auVar55._12_4_ >> auVar71;
LAB_0041eae5:
    coeff[8] = iVar86;
    coeff[9] = iVar93;
    coeff[10] = iVar94;
    coeff[0xb] = iVar95;
LAB_0041eaea:
    coeff[0xc] = iVar76;
    coeff[0xd] = iVar83;
    coeff[0xe] = iVar84;
    coeff[0xf] = iVar85;
    return;
  case 5:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)input;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *(ulong *)(input + input_stride);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = *(ulong *)(input + input_stride * 2);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar28 = pshuflw(auVar32,auVar32,0x1b);
    auVar28 = pmovsxwd(auVar28,auVar28);
    auVar42 = pshuflw(auVar44,auVar44,0x1b);
    auVar42 = pmovsxwd(auVar42,auVar42);
    auVar55 = pshuflw(auVar58,auVar58,0x1b);
    auVar55 = pmovsxwd(auVar55,auVar55);
    auVar61 = pshuflw(auVar63,auVar63,0x1b);
    auVar61 = pmovsxwd(auVar61,auVar61);
LAB_0041eb41:
    iVar17 = (int)cVar5;
    iVar102 = auVar28._0_4_ << iVar17;
    iVar103 = auVar42._0_4_ << iVar17;
    iVar104 = auVar55._0_4_ << iVar17;
    iVar17 = auVar61._0_4_ << iVar17;
    auVar80 = ZEXT416(0xd);
    auVar100._8_4_ = 0x16a1;
    auVar100._0_8_ = 0x16a1000016a1;
    auVar100._12_4_ = 0x16a1;
    auVar91._8_4_ = 0xc3f;
    auVar91._0_8_ = 0xc3f00000c3f;
    auVar91._12_4_ = 0xc3f;
    auVar110._8_4_ = 0x1d90;
    auVar110._0_8_ = 0x1d9000001d90;
    auVar110._12_4_ = 0x1d90;
    auVar72._0_4_ = iVar17 + iVar102;
    auVar72._4_4_ = auVar61._4_4_ + auVar28._4_4_;
    auVar72._8_4_ = auVar61._8_4_ + auVar28._8_4_;
    auVar72._12_4_ = auVar61._12_4_ + auVar28._12_4_;
    auVar33._0_4_ = iVar102 - iVar17;
    auVar33._4_4_ = auVar28._4_4_ - auVar61._4_4_;
    auVar33._8_4_ = auVar28._8_4_ - auVar61._8_4_;
    auVar33._12_4_ = auVar28._12_4_ - auVar61._12_4_;
    auVar64._0_4_ = iVar104 + iVar103;
    auVar64._4_4_ = auVar55._4_4_ + auVar42._4_4_;
    auVar64._8_4_ = auVar55._8_4_ + auVar42._8_4_;
    auVar64._12_4_ = auVar55._12_4_ + auVar42._12_4_;
    auVar45._0_4_ = iVar103 - iVar104;
    auVar45._4_4_ = auVar42._4_4_ - auVar55._4_4_;
    auVar45._8_4_ = auVar42._8_4_ - auVar55._8_4_;
    auVar45._12_4_ = auVar42._12_4_ - auVar55._12_4_;
    auVar71 = pmulld(auVar72,auVar100);
    auVar55 = pmulld(auVar64,auVar100);
    iVar17 = auVar71._0_4_ + 0x1000;
    iVar102 = auVar71._8_4_ + 0x1000;
    auVar61 = pmulld(auVar91,auVar45);
    auVar42 = pmulld(auVar45,auVar110);
    auVar111 = pmulld(auVar110,auVar33);
    auVar28 = pmulld(auVar33,auVar91);
    _local_58 = CONCAT44(auVar61._0_4_ + 0x1000 + auVar111._0_4_ >> auVar80,
                         iVar17 + auVar55._0_4_ >> auVar80);
    uStack_50 = CONCAT44((auVar28._0_4_ + 0x1000) - auVar42._0_4_ >> auVar80,
                         iVar17 - auVar55._0_4_ >> auVar80);
    local_48._8_4_ = auVar71._4_4_ + 0x1000 + auVar55._4_4_ >> auVar80;
    local_48._12_4_ = auVar61._4_4_ + 0x1000 + auVar111._4_4_ >> auVar80;
    local_38._4_4_ = auVar61._8_4_ + 0x1000 + auVar111._8_4_ >> auVar80;
    local_38._0_4_ = iVar102 + auVar55._8_4_ >> auVar80;
    local_38._8_4_ = iVar102 - auVar55._8_4_ >> auVar80;
    local_38._12_4_ = (auVar28._8_4_ + 0x1000) - auVar42._8_4_ >> auVar80;
    local_28._8_4_ = auVar71._12_4_ + 0x1000 + auVar55._12_4_ >> auVar80;
    local_28._12_4_ = auVar61._12_4_ + 0x1000 + auVar111._12_4_ >> auVar80;
    goto LAB_0041f030;
  case 6:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    uVar1 = *(ulong *)(input + input_stride * 3);
    uVar2 = *(ulong *)(input + input_stride * 2);
    uVar3 = *(ulong *)(input + input_stride);
    uVar4 = *(ulong *)input;
    goto LAB_0041ed8b;
  case 7:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    uVar1 = *(ulong *)input;
    uVar2 = *(ulong *)(input + input_stride);
    uVar3 = *(ulong *)(input + input_stride * 2);
    uVar4 = *(ulong *)(input + input_stride * 3);
LAB_0041ed8b:
    iVar17 = (int)cVar5;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar4;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar3;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar2;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar1;
    auVar28 = pshuflw(auVar30,auVar30,0x1b);
    auVar28 = pmovsxwd(auVar28,auVar28);
    auVar42 = pshuflw(auVar43,auVar43,0x1b);
    auVar42 = pmovsxwd(auVar42,auVar42);
    auVar55 = pshuflw(auVar56,auVar56,0x1b);
    auVar55 = pmovsxwd(auVar55,auVar55);
    auVar61 = pshuflw(auVar62,auVar62,0x1b);
    auVar61 = pmovsxwd(auVar61,auVar61);
    goto LAB_0041ef8a;
  case 8:
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)(input + input_stride * 3));
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride * 2));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)input);
LAB_0041ef8a:
    iStack_54 = auVar28._4_4_;
    local_58 = (undefined1  [4])(auVar28._0_4_ << iVar17);
    uStack_50._0_4_ = auVar28._8_4_;
    uStack_50._4_4_ = auVar28._12_4_;
    local_48._4_4_ = auVar42._4_4_;
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    uVar12 = local_48._4_4_;
    uVar13 = local_48._8_4_;
    uVar14 = local_48._12_4_;
    lVar69 = CONCAT44(local_48._0_4_,local_58);
    lVar77 = CONCAT44(local_28._0_4_,local_38._0_4_);
    local_48._8_4_ = iStack_54;
    local_48._12_4_ = uVar12;
    local_38._4_4_ = uVar13;
    local_38._0_4_ = (int)uStack_50;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uStack_50._4_4_;
    local_28._12_4_ = uVar14;
    _local_58 = lVar69;
    uStack_50 = lVar77;
LAB_0041f030:
    paiVar19 = av1_fwd_cos_bit_row;
LAB_0041f037:
    cVar5 = (*paiVar19)[0];
LAB_0041f03a:
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,(int)cVar5,1);
    *(longlong *)coeff = _local_58;
    *(longlong *)(coeff + 2) = uStack_50;
    *(undefined8 *)(coeff + 4) = local_48._0_8_;
    *(undefined8 *)(coeff + 6) = local_48._8_8_;
    *(undefined8 *)(coeff + 8) = local_38._0_8_;
    *(undefined8 *)(coeff + 10) = local_38._8_8_;
    goto LAB_0041f069;
  case 9:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    iVar21 = auVar28._0_4_ << iVar17;
    uVar37 = auVar28._4_4_;
    alVar27[0] = CONCAT44(uVar37,iVar21);
    alVar27[1]._0_4_ = auVar28._8_4_;
    alVar27[1]._4_4_ = auVar28._12_4_;
    _local_58 = alVar27[0];
    uStack_50 = alVar27[1];
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._4_4_ = auVar42._4_4_;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    lVar18 = 0;
    auVar28 = pmovsxwd((undefined1  [16])alVar27,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    iVar17 = iStack_54;
    uVar12 = (int)uStack_50;
    uVar13 = uStack_50._4_4_;
    uVar14 = local_48._4_4_;
    uVar15 = local_48._8_4_;
    uVar16 = local_48._12_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    local_48._8_4_ = iVar17;
    local_48._12_4_ = uVar14;
    local_38._4_4_ = uVar15;
    local_38._0_4_ = uVar12;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uVar13;
    local_28._12_4_ = uVar16;
    lVar18 = 0;
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    break;
  case 10:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    iVar102 = auVar28._0_4_ << iVar17;
    iVar103 = auVar42._0_4_ << iVar17;
    iVar104 = auVar55._0_4_ << iVar17;
    iVar17 = auVar61._0_4_ << iVar17;
    auVar71 = ZEXT416(0xd);
    auVar101._8_4_ = 0x16a1;
    auVar101._0_8_ = 0x16a1000016a1;
    auVar101._12_4_ = 0x16a1;
    auVar92._8_4_ = 0xc3f;
    auVar92._0_8_ = 0xc3f00000c3f;
    auVar92._12_4_ = 0xc3f;
    auVar112._8_4_ = 0x1d90;
    auVar112._0_8_ = 0x1d9000001d90;
    auVar112._12_4_ = 0x1d90;
    auVar73._0_4_ = iVar17 + iVar102;
    auVar73._4_4_ = auVar61._4_4_ + auVar28._4_4_;
    auVar73._8_4_ = auVar61._8_4_ + auVar28._8_4_;
    auVar73._12_4_ = auVar61._12_4_ + auVar28._12_4_;
    auVar35._0_4_ = iVar102 - iVar17;
    auVar35._4_4_ = auVar28._4_4_ - auVar61._4_4_;
    auVar35._8_4_ = auVar28._8_4_ - auVar61._8_4_;
    auVar35._12_4_ = auVar28._12_4_ - auVar61._12_4_;
    auVar65._0_4_ = iVar104 + iVar103;
    auVar65._4_4_ = auVar55._4_4_ + auVar42._4_4_;
    auVar65._8_4_ = auVar55._8_4_ + auVar42._8_4_;
    auVar65._12_4_ = auVar55._12_4_ + auVar42._12_4_;
    auVar46._0_4_ = iVar103 - iVar104;
    auVar46._4_4_ = auVar42._4_4_ - auVar55._4_4_;
    auVar46._8_4_ = auVar42._8_4_ - auVar55._8_4_;
    auVar46._12_4_ = auVar42._12_4_ - auVar55._12_4_;
    auVar28 = pmulld(auVar73,auVar101);
    auVar55 = pmulld(auVar65,auVar101);
    iVar102 = auVar28._0_4_ + 0x1000;
    iVar103 = auVar28._4_4_ + 0x1000;
    iVar104 = auVar28._8_4_ + 0x1000;
    iVar75 = auVar28._12_4_ + 0x1000;
    local_58 = (undefined1  [4])(iVar102 + auVar55._0_4_ >> auVar71);
    iVar17 = iVar103 + auVar55._4_4_ >> auVar71;
    auVar47._4_4_ = iVar17;
    auVar47._0_4_ = local_58;
    uStack_50._0_4_ = iVar102 - auVar55._0_4_ >> auVar71;
    iVar102 = iVar103 - auVar55._4_4_ >> auVar71;
    auVar82._4_4_ = iVar102;
    auVar82._0_4_ = (int)uStack_50;
    auVar61 = pmulld(auVar92,auVar46);
    auVar42 = pmulld(auVar46,auVar112);
    auVar80 = pmulld(auVar112,auVar35);
    auVar28 = pmulld(auVar35,auVar92);
    auVar47._8_4_ = iVar17;
    auVar47._12_4_ = auVar61._4_4_ + 0x1000 + auVar80._4_4_ >> auVar71;
    iStack_54 = auVar61._0_4_ + 0x1000 + auVar80._0_4_ >> auVar71;
    auVar82._8_4_ = iVar102;
    auVar82._12_4_ = (auVar28._4_4_ + 0x1000) - auVar42._4_4_ >> auVar71;
    uStack_50._4_4_ = (auVar28._0_4_ + 0x1000) - auVar42._0_4_ >> auVar71;
    auVar59._0_8_ =
         CONCAT44(auVar61._8_4_ + 0x1000 + auVar80._8_4_ >> auVar71,
                  iVar104 + auVar55._8_4_ >> auVar71);
    auVar59._8_4_ = iVar75 + auVar55._12_4_ >> auVar71;
    auVar59._12_4_ = auVar61._12_4_ + 0x1000 + auVar80._12_4_ >> auVar71;
    auVar74._0_8_ =
         CONCAT44((auVar28._8_4_ + 0x1000) - auVar42._8_4_ >> auVar71,
                  iVar104 - auVar55._8_4_ >> auVar71);
    auVar74._8_4_ = iVar75 - auVar55._12_4_ >> auVar71;
    auVar74._12_4_ = (auVar28._12_4_ + 0x1000) - auVar42._12_4_ >> auVar71;
    local_48._8_8_ = auVar82._8_8_;
    local_48._0_8_ = auVar47._8_8_;
    local_38._8_8_ = auVar74._0_8_;
    local_38._0_8_ = auVar59._0_8_;
    local_28._8_8_ = auVar74._8_8_;
    local_28._0_8_ = auVar59._8_8_;
    lVar18 = 0;
    auVar28 = pmovsxwd(local_38,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    break;
  case 0xb:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    iVar20 = auVar28._0_4_ << iVar17;
    uVar36 = auVar28._4_4_;
    alVar25[0] = CONCAT44(uVar36,iVar20);
    alVar25[1]._0_4_ = auVar28._8_4_;
    alVar25[1]._4_4_ = auVar28._12_4_;
    _local_58 = alVar25[0];
    uStack_50 = alVar25[1];
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._4_4_ = auVar42._4_4_;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    lVar18 = 0;
    auVar28 = pmovsxwd((undefined1  [16])alVar25,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    auVar71 = ZEXT416(0xd);
    auVar89._8_4_ = 0xc3f;
    auVar89._0_8_ = 0xc3f00000c3f;
    auVar89._12_4_ = 0xc3f;
    auVar108._8_4_ = 0x1d90;
    auVar108._0_8_ = 0x1d9000001d90;
    auVar108._12_4_ = 0x1d90;
    auVar98._0_4_ = uStack_50._4_4_ + (int)local_58;
    auVar98._4_4_ = local_48._12_4_ + local_48._0_4_;
    auVar98._8_4_ = local_38._12_4_ + local_38._0_4_;
    auVar98._12_4_ = local_28._12_4_ + local_28._0_4_;
    auVar79._0_4_ = (int)local_58 - uStack_50._4_4_;
    auVar79._4_4_ = local_48._0_4_ - local_48._12_4_;
    auVar79._8_4_ = local_38._0_4_ - local_38._12_4_;
    auVar79._12_4_ = local_28._0_4_ - local_28._12_4_;
    auVar53._0_4_ = (int)uStack_50 + iStack_54;
    auVar53._4_4_ = local_48._8_4_ + local_48._4_4_;
    auVar53._8_4_ = local_38._8_4_ + local_38._4_4_;
    auVar53._12_4_ = local_28._8_4_ + local_28._4_4_;
    auVar26._0_4_ = iStack_54 - (int)uStack_50;
    auVar26._4_4_ = local_48._4_4_ - local_48._8_4_;
    auVar26._8_4_ = local_38._4_4_ - local_38._8_4_;
    auVar26._12_4_ = local_28._4_4_ - local_28._8_4_;
    auVar6._8_4_ = 0x16a1;
    auVar6._0_8_ = 0x16a1000016a1;
    auVar6._12_4_ = 0x16a1;
    auVar28 = pmulld(auVar98,auVar6);
    auVar7._8_4_ = 0x16a1;
    auVar7._0_8_ = 0x16a1000016a1;
    auVar7._12_4_ = 0x16a1;
    auVar42 = pmulld(auVar53,auVar7);
    iVar17 = auVar28._0_4_ + 0x1000;
    iVar102 = auVar28._4_4_ + 0x1000;
    iVar103 = auVar28._8_4_ + 0x1000;
    iVar104 = auVar28._12_4_ + 0x1000;
    auVar55 = pmulld(auVar26,auVar89);
    auVar61 = pmulld(auVar79,auVar108);
    auVar80 = pmulld(auVar79,auVar89);
    auVar28 = pmulld(auVar26,auVar108);
    iVar76 = (auVar80._0_4_ + 0x1000) - auVar28._0_4_ >> auVar71;
    iVar83 = (auVar80._4_4_ + 0x1000) - auVar28._4_4_ >> auVar71;
    iVar84 = (auVar80._8_4_ + 0x1000) - auVar28._8_4_ >> auVar71;
    iVar85 = (auVar80._12_4_ + 0x1000) - auVar28._12_4_ >> auVar71;
    *coeff = auVar42._0_4_ + iVar17 >> auVar71;
    coeff[1] = auVar42._4_4_ + iVar102 >> auVar71;
    coeff[2] = auVar42._8_4_ + iVar103 >> auVar71;
    coeff[3] = auVar42._12_4_ + iVar104 >> auVar71;
    coeff[4] = auVar61._0_4_ + 0x1000 + auVar55._0_4_ >> auVar71;
    coeff[5] = auVar61._4_4_ + 0x1000 + auVar55._4_4_ >> auVar71;
    coeff[6] = auVar61._8_4_ + 0x1000 + auVar55._8_4_ >> auVar71;
    coeff[7] = auVar61._12_4_ + 0x1000 + auVar55._12_4_ >> auVar71;
    coeff[8] = iVar17 - auVar42._0_4_ >> auVar71;
    coeff[9] = iVar102 - auVar42._4_4_ >> auVar71;
    coeff[10] = iVar103 - auVar42._8_4_ >> auVar71;
    coeff[0xb] = iVar104 - auVar42._12_4_ >> auVar71;
    goto LAB_0041eaea;
  case 0xc:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    iStack_54 = auVar28._4_4_;
    local_58 = (undefined1  [4])(auVar28._0_4_ << iVar17);
    uStack_50._0_4_ = auVar28._8_4_;
    uStack_50._4_4_ = auVar28._12_4_;
    local_48._4_4_ = auVar42._4_4_;
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    iVar17 = iStack_54;
    uVar12 = (int)uStack_50;
    uVar13 = uStack_50._4_4_;
    uVar14 = local_48._4_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    auVar111._0_8_ = CONCAT44(local_48._8_4_,uVar12);
    auVar111._8_4_ = uVar13;
    auVar111._12_4_ = local_48._12_4_;
    auVar54._0_8_ = CONCAT44(local_28._8_4_,local_38._8_4_);
    auVar54._8_4_ = local_38._12_4_;
    auVar54._12_4_ = local_28._12_4_;
    local_48._8_4_ = iVar17;
    local_48._12_4_ = uVar14;
    local_38._8_8_ = auVar54._0_8_;
    local_38._0_8_ = auVar111._0_8_;
    local_28._8_8_ = auVar54._8_8_;
    local_28._0_8_ = auVar111._8_8_;
    lVar18 = 0;
    auVar28 = pmovsxwd(local_28,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_38,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    break;
  case 0xd:
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)input);
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)(input + input_stride * 3));
    iVar23 = auVar28._0_4_ << iVar17;
    uVar39 = auVar28._4_4_;
    alVar34[0] = CONCAT44(uVar39,iVar23);
    alVar34[1]._0_4_ = auVar28._8_4_;
    alVar34[1]._4_4_ = auVar28._12_4_;
    _local_58 = alVar34[0];
    uStack_50 = alVar34[1];
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._4_4_ = auVar42._4_4_;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    lVar18 = 0;
    auVar28 = pmovsxwd((undefined1  [16])alVar34,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    uVar12 = local_48._4_4_;
    uVar13 = local_48._8_4_;
    uVar14 = local_48._12_4_;
    lVar69 = CONCAT44(local_48._0_4_,local_58);
    lVar77 = CONCAT44(local_28._0_4_,local_38._0_4_);
    local_48._8_4_ = iStack_54;
    local_48._12_4_ = uVar12;
    local_38._4_4_ = uVar13;
    local_38._0_4_ = (int)uStack_50;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uStack_50._4_4_;
    local_28._12_4_ = uVar14;
    paiVar19 = av1_fwd_cos_bit_col;
    _local_58 = lVar69;
    uStack_50 = lVar77;
    goto LAB_0041f037;
  case 0xe:
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar28 = pmovsxwd(in_XMM0,*(undefined8 *)(input + input_stride * 3));
    auVar42 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride * 2));
    auVar55 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride));
    auVar61 = pmovsxwd(in_XMM3,*(undefined8 *)input);
    iStack_54 = auVar28._4_4_;
    local_58 = (undefined1  [4])(auVar28._0_4_ << iVar17);
    uStack_50._0_4_ = auVar28._8_4_;
    uStack_50._4_4_ = auVar28._12_4_;
    local_48._4_4_ = auVar42._4_4_;
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar17;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    iVar17 = iStack_54;
    uVar12 = (int)uStack_50;
    uVar13 = uStack_50._4_4_;
    uVar14 = local_48._4_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    auVar71._0_8_ = CONCAT44(local_48._8_4_,uVar12);
    auVar71._8_4_ = uVar13;
    auVar71._12_4_ = local_48._12_4_;
    auVar80._0_8_ = CONCAT44(local_28._8_4_,local_38._8_4_);
    auVar80._8_4_ = local_38._12_4_;
    auVar80._12_4_ = local_28._12_4_;
    local_48._8_4_ = iVar17;
    local_48._12_4_ = uVar14;
    local_38._8_8_ = auVar80._0_8_;
    local_38._0_8_ = auVar71._0_8_;
    local_28._8_8_ = auVar80._8_8_;
    local_28._0_8_ = auVar71._8_8_;
    lVar18 = 0;
    auVar28 = pmovsxwd(local_28,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_38,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    break;
  case 0xf:
    iVar17 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)input;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(input + input_stride);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *(ulong *)(input + input_stride * 2);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar28 = pshuflw(auVar28,auVar28,0x1b);
    auVar28 = pmovsxwd(auVar28,auVar28);
    auVar42 = pshuflw(auVar42,auVar42,0x1b);
    auVar42 = pmovsxwd(auVar42,auVar42);
    auVar55 = pshuflw(auVar55,auVar55,0x1b);
    auVar55 = pmovsxwd(auVar55,auVar55);
    auVar61 = pshuflw(auVar61,auVar61,0x1b);
    iVar22 = auVar28._0_4_ << iVar17;
    uVar38 = auVar28._4_4_;
    alVar29[0] = CONCAT44(uVar38,iVar22);
    alVar29[1]._0_4_ = auVar28._8_4_;
    alVar29[1]._4_4_ = auVar28._12_4_;
    auVar28 = pmovsxwd(auVar61,auVar61);
    _local_58 = alVar29[0];
    uStack_50 = alVar29[1];
    local_48._0_4_ = auVar42._0_4_ << iVar17;
    local_48._4_4_ = auVar42._4_4_;
    local_48._8_4_ = auVar42._8_4_;
    local_48._12_4_ = auVar42._12_4_;
    local_38._4_4_ = auVar55._4_4_;
    local_38._0_4_ = auVar55._0_4_ << iVar17;
    local_38._8_4_ = auVar55._8_4_;
    local_38._12_4_ = auVar55._12_4_;
    local_28._4_4_ = auVar28._4_4_;
    local_28._0_4_ = auVar28._0_4_ << iVar17;
    local_28._8_4_ = auVar28._8_4_;
    local_28._12_4_ = auVar28._12_4_;
    cVar5 = '\r';
    lVar18 = 0;
    auVar28 = pmovsxwd((undefined1  [16])alVar29,0x16a116a116a116a1);
    auVar42 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar55 = pmulld(*(undefined1 (*) [16])(local_58 + lVar18),auVar28);
      *(int *)(local_58 + lVar18) = auVar55._0_4_ + auVar42._0_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 4) = auVar55._4_4_ + auVar42._4_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 8) = auVar55._8_4_ + auVar42._8_4_ >> 0xc;
      *(int *)(local_58 + lVar18 + 0xc) = auVar55._12_4_ + auVar42._12_4_ >> 0xc;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    uVar12 = local_48._4_4_;
    uVar13 = local_48._8_4_;
    uVar14 = local_48._12_4_;
    lVar69 = CONCAT44(local_48._0_4_,local_58);
    lVar77 = CONCAT44(local_28._0_4_,local_38._0_4_);
    local_48._8_4_ = iStack_54;
    local_48._12_4_ = uVar12;
    local_38._4_4_ = uVar13;
    local_38._0_4_ = (int)uStack_50;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uStack_50._4_4_;
    local_28._12_4_ = uVar14;
    _local_58 = lVar69;
    uStack_50 = lVar77;
    goto LAB_0041f03a;
  }
  *(longlong *)coeff = _local_58;
  *(longlong *)(coeff + 2) = uStack_50;
  *(undefined8 *)(coeff + 4) = local_48._0_8_;
  *(undefined8 *)(coeff + 6) = local_48._8_8_;
  *(undefined8 *)(coeff + 8) = local_38._0_8_;
  *(undefined8 *)(coeff + 10) = local_38._8_8_;
LAB_0041f069:
  *(undefined8 *)(coeff + 0xc) = local_28._0_8_;
  *(undefined8 *)(coeff + 0xe) = local_28._8_8_;
  return;
}

Assistant:

void av1_fwd_txfm2d_4x4_sse4_1(const int16_t *input, int32_t *coeff,
                               int input_stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case IDTX:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}